

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

int trico_read_attributes_uint8(void *a,uint8_t **attrib)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  uint *puVar4;
  bool bVar5;
  int iVar6;
  undefined8 in_RAX;
  char *source;
  int iVar7;
  uint unaff_R13D;
  ulong __size;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  iVar7 = 0;
  iVar6 = 0;
  if (*(int *)((long)a + 0x24) == 0x11) {
    iVar2 = *(int *)((long)a + 0x40);
    bVar5 = true;
    if ((iVar2 == 0) &&
       (piVar3 = *(int **)((long)a + 0x18),
       (ulong)((long)piVar3 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30))) {
      local_34 = *piVar3;
      *(int **)((long)a + 0x18) = piVar3 + 1;
      bVar5 = false;
    }
    iVar6 = iVar7;
    if (!bVar5) {
      bVar5 = true;
      if ((iVar2 == 0) &&
         (puVar4 = *(uint **)((long)a + 0x18),
         (ulong)((long)puVar4 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30))) {
        unaff_R13D = *puVar4;
        *(uint **)((long)a + 0x18) = puVar4 + 1;
        bVar5 = false;
      }
      if (!bVar5) {
        __size = (ulong)unaff_R13D;
        source = (char *)malloc(__size);
        if (iVar2 == 0) {
          lVar1 = (long)*(void **)((long)a + 0x18) + __size;
          if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30)) {
            memcpy(source,*(void **)((long)a + 0x18),__size);
            *(long *)((long)a + 0x18) = lVar1;
            if ((attrib != (uint8_t **)0x0) &&
               (iVar6 = LZ4_decompress_safe(source,(char *)attrib,unaff_R13D,local_34),
               iVar6 != local_34)) {
              __assert_fail("bytes_decompressed == nr_of_attribs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                            ,0x5a0,"int trico_read_attributes_uint8(void *, uint8_t **)");
            }
            free(source);
            read_next_stream_type((trico_archive *)a);
            iVar6 = 1;
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int trico_read_attributes_uint8(void* a, uint8_t** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_attribute_uint8_stream)
    return 0;

  uint32_t nr_of_attribs;
  if (!read(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;

  if (attrib != NULL)
    {
    uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)attrib, nr_of_compressed_bytes, nr_of_attribs);
    assert(bytes_decompressed == nr_of_attribs);
    (void)bytes_decompressed; //suppress warning
    }

  trico_free(compressed);  

  read_next_stream_type(arch);

  return 1;
  }